

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::Miner::execCommand(Miner *this,char command)

{
  bool bVar1;
  reference ppIVar2;
  undefined8 extraout_RDX;
  char in_SIL;
  Miner *in_RDI;
  IBackend *backend;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range1;
  bool in_stack_0000004f;
  Miner *in_stack_00000050;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_20;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *local_18;
  char local_9;
  
  local_9 = in_SIL;
  if (in_SIL == 'H') {
LAB_00230011:
    printHashrate(in_stack_00000050,in_stack_0000004f);
  }
  else {
    if (in_SIL == 'P') {
LAB_00230022:
      setEnabled(in_RDI,(bool)in_stack_ffffffffffffffbf);
      goto LAB_00230043;
    }
    if (in_SIL != 'R') {
      if (in_SIL == 'h') goto LAB_00230011;
      if (in_SIL == 'p') goto LAB_00230022;
      if (in_SIL != 'r') goto LAB_00230043;
    }
    setEnabled(in_RDI,(bool)in_stack_ffffffffffffffbf);
  }
LAB_00230043:
  local_18 = &in_RDI->d_ptr->backends;
  local_20._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
                  CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end
            ((vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *)
             CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)in_RDI,
                            (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)), bVar1
        ) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_20);
    (*(*ppIVar2)->_vptr_IBackend[6])(*ppIVar2,(ulong)(uint)(int)local_9,extraout_RDX,local_9);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void xmrig::Miner::execCommand(char command)
{
    switch (command) {
    case 'h':
    case 'H':
        printHashrate(true);
        break;

    case 'p':
    case 'P':
        setEnabled(false);
        break;

    case 'r':
    case 'R':
        setEnabled(true);
        break;

    default:
        break;
    }

    for (auto backend : d_ptr->backends) {
        backend->execCommand(command);
    }
}